

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_r20.cpp
# Opt level: O0

void __thiscall r20_order_Test::~r20_order_Test(r20_order_Test *this)

{
  r20_order_Test *this_local;
  
  ~r20_order_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(r20, order)
{
    std::size_t unit_count{0};
    const void* r20 = units::detail::r20rawData(unit_count);
    const auto* r20data = reinterpret_cast<const unitD*>(r20);
    for (size_t ii = 1; ii < unit_count; ++ii) {
        EXPECT_LT(
            std::string(std::get<0>(r20data[ii - 1])),
            std::string(std::get<0>(r20data[ii])));
    }
}